

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O0

int __thiscall
capnp::TwoPartyServer::accept(TwoPartyServer *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  undefined4 in_register_00000034;
  undefined1 local_58 [8];
  Promise<void> promise;
  undefined1 local_30 [8];
  Own<capnp::TwoPartyServer::AcceptedConnection,_std::nullptr_t> connectionState;
  AsyncIoStream *connection_local;
  TwoPartyServer *this_local;
  
  connectionState.ptr = (AcceptedConnection *)__addr;
  kj::Own<kj::AsyncIoStream,_std::nullptr_t>::Own
            ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&stack0xffffffffffffffc0,
             (AsyncIoStream *)__addr,(Disposer *)&kj::NullDisposer::instance);
  kj::
  heap<capnp::TwoPartyServer::AcceptedConnection,capnp::TwoPartyServer&,kj::Own<kj::AsyncIoStream,decltype(nullptr)>>
            ((kj *)local_30,(TwoPartyServer *)CONCAT44(in_register_00000034,__fd),
             (Own<kj::AsyncIoStream,_std::nullptr_t> *)&stack0xffffffffffffffc0);
  kj::Own<kj::AsyncIoStream,_std::nullptr_t>::~Own
            ((Own<kj::AsyncIoStream,_std::nullptr_t> *)&stack0xffffffffffffffc0);
  kj::Own<capnp::TwoPartyServer::AcceptedConnection,_std::nullptr_t>::operator->
            ((Own<capnp::TwoPartyServer::AcceptedConnection,_std::nullptr_t> *)local_30);
  TwoPartyVatNetwork::onDisconnect((TwoPartyVatNetwork *)local_58);
  kj::mv<kj::Own<capnp::TwoPartyServer::AcceptedConnection,decltype(nullptr)>>
            ((Own<capnp::TwoPartyServer::AcceptedConnection,_std::nullptr_t> *)local_30);
  kj::Promise<void>::attach<kj::Own<capnp::TwoPartyServer::AcceptedConnection,decltype(nullptr)>>
            ((Promise<void> *)this,
             (Own<capnp::TwoPartyServer::AcceptedConnection,_std::nullptr_t> *)local_58);
  kj::Promise<void>::~Promise((Promise<void> *)local_58);
  kj::Own<capnp::TwoPartyServer::AcceptedConnection,_std::nullptr_t>::~Own
            ((Own<capnp::TwoPartyServer::AcceptedConnection,_std::nullptr_t> *)local_30);
  return (int)this;
}

Assistant:

kj::Promise<void> TwoPartyServer::accept(kj::AsyncIoStream& connection) {
  auto connectionState = kj::heap<AcceptedConnection>(*this,
      kj::Own<kj::AsyncIoStream>(&connection, kj::NullDisposer::instance));

  // Run the connection until disconnect.
  auto promise = connectionState->network.onDisconnect();
  return promise.attach(kj::mv(connectionState));
}